

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrArray.h
# Opt level: O0

void __thiscall
irr::core::array<irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::SAttribute>::reallocate
          (array<irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::SAttribute> *this,
          u32 new_size)

{
  SAttribute *pSVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  SAttribute *pSVar6;
  ulong uVar7;
  u32 local_74;
  SAttribute *local_60;
  int local_34;
  s32 i;
  s32 end;
  SAttribute *old_data;
  u32 new_size_local;
  array<irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::SAttribute> *this_local;
  
  pSVar1 = this->data;
  uVar3 = CONCAT44(0,new_size);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar3;
  uVar4 = SUB168(auVar2 * ZEXT816(0x20),0);
  uVar7 = uVar4 + 8;
  if (SUB168(auVar2 * ZEXT816(0x20),8) != 0 || 0xfffffffffffffff7 < uVar4) {
    uVar7 = 0xffffffffffffffff;
  }
  puVar5 = (ulong *)operator_new__(uVar7);
  *puVar5 = uVar3;
  pSVar6 = (SAttribute *)(puVar5 + 1);
  if (uVar3 != 0) {
    local_60 = pSVar6;
    do {
      irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::SAttribute::SAttribute(local_60);
      local_60 = local_60 + 1;
    } while (local_60 != pSVar6 + uVar3);
  }
  this->data = pSVar6;
  this->allocated = new_size;
  local_74 = new_size;
  if (this->used < new_size) {
    local_74 = this->used;
  }
  for (local_34 = 0; local_34 < (int)local_74; local_34 = local_34 + 1) {
    irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::SAttribute::operator=
              (this->data + local_34,pSVar1 + local_34);
  }
  if (this->allocated < this->used) {
    this->used = this->allocated;
  }
  if (pSVar1 != (SAttribute *)0x0) {
    pSVar6 = pSVar1 + *(long *)&pSVar1[-1].Value.allocated;
    while (pSVar1 != pSVar6) {
      pSVar6 = pSVar6 + -1;
      irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::SAttribute::~SAttribute(pSVar6);
    }
    operator_delete__(&pSVar1[-1].Value.allocated);
  }
  return;
}

Assistant:

void reallocate(u32 new_size)
	{
		T* old_data = data;

		data = new T[new_size];
		allocated = new_size;
		
		s32 end = used < new_size ? used : new_size;
		for (s32 i=0; i<end; ++i)
			data[i] = old_data[i];

		if (allocated < used)
			used = allocated;
		
		delete [] old_data;
	}